

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

bool QSslSocket::setActiveBackend(QString *backendName)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug QStack_58;
  QArrayDataPointer<QString> local_50;
  char *local_38;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((backendName->d).size == 0) {
    pQVar2 = QtPrivateLogging::lcSsl();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0) {
      bVar1 = false;
    }
    else {
      local_38 = pQVar2->name;
      local_50.d._0_4_ = 2;
      local_50._4_8_ = 0;
      local_50._12_8_ = 0;
      local_50.size._4_4_ = 0;
      bVar1 = false;
      QMessageLogger::warning
                ((char *)&local_50,"Invalid parameter (backend name cannot be an empty string)");
    }
  }
  else {
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._0_8_ = &QSslSocketPrivate::backendMutex;
    QBasicMutex::lock(&QSslSocketPrivate::backendMutex.super_QBasicMutex);
    local_30[8] = 1;
    if (QSslSocketPrivate::tlsBackend == (QTlsBackend *)0x0) {
      QTlsBackend::availableBackendNames();
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&local_50,backendName,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
      if (bVar1) {
        QString::operator=(&QSslSocketPrivate::activeBackendName,(QString *)backendName);
        bVar1 = true;
      }
      else {
        pQVar2 = QtPrivateLogging::lcSsl();
        if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_38 = pQVar2->name;
          local_50.d._0_4_ = 2;
          local_50._4_8_ = 0;
          local_50._12_8_ = 0;
          local_50.size._4_4_ = 0;
          QMessageLogger::warning();
          pQVar3 = QDebug::operator<<(&QStack_58,"Cannot set unavailable backend named");
          pQVar3 = QDebug::operator<<(pQVar3,backendName);
          QDebug::operator<<(pQVar3,"as active");
          QDebug::~QDebug(&QStack_58);
        }
        bVar1 = false;
      }
    }
    else {
      pQVar2 = QtPrivateLogging::lcSsl();
      if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_38 = pQVar2->name;
        local_50.d._0_4_ = 2;
        local_50._4_8_ = 0;
        local_50._12_8_ = 0;
        local_50.size._4_4_ = 0;
        QMessageLogger::warning();
        pQVar3 = QDebug::operator<<(&QStack_58,"Cannot set backend named");
        pQVar3 = QDebug::operator<<(pQVar3,backendName);
        QDebug::operator<<(pQVar3,"as active, another backend is already in use");
        QDebug::~QDebug(&QStack_58);
      }
      QBasicMutex::unlock(&QSslSocketPrivate::backendMutex.super_QBasicMutex);
      local_30._8_8_ = local_30._8_8_ & 0xffffffffffffff00;
      activeBackend();
      bVar1 = comparesEqual((QString *)&local_50,backendName);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::setActiveBackend(const QString &backendName)
{
    if (!backendName.size()) {
        qCWarning(lcSsl, "Invalid parameter (backend name cannot be an empty string)");
        return false;
    }

    QMutexLocker locker(&QSslSocketPrivate::backendMutex);
    if (QSslSocketPrivate::tlsBackend) {
        qCWarning(lcSsl) << "Cannot set backend named" << backendName
                         << "as active, another backend is already in use";
        locker.unlock();
        return activeBackend() == backendName;
    }

    if (!QTlsBackend::availableBackendNames().contains(backendName)) {
        qCWarning(lcSsl) << "Cannot set unavailable backend named" << backendName
                         << "as active";
        return false;
    }

    QSslSocketPrivate::activeBackendName = backendName;

    return true;
}